

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O3

bool is_col_taken(vector<bool,_std::allocator<bool>_> *col_is_taken,
                 robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *col_is_taken_s,size_t col_num)

{
  _Bit_type *p_Var1;
  const_iterator cVar2;
  size_t sVar3;
  bool bVar4;
  size_t local_10;
  
  p_Var1 = (col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((p_Var1 == (col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
     ((col_is_taken->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    local_10 = col_num;
    cVar2 = tsl::detail_robin_hash::
            robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            ::find_impl<unsigned_long>(&col_is_taken_s->m_ht,&local_10,col_num);
    bVar4 = cVar2.m_bucket !=
            (col_is_taken_s->m_ht).m_buckets + (col_is_taken_s->m_ht).m_bucket_count;
  }
  else {
    sVar3 = col_num + 0x3f;
    if (-1 < (long)col_num) {
      sVar3 = col_num;
    }
    bVar4 = (p_Var1[((long)sVar3 >> 6) +
                    ((ulong)((col_num & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
             (col_num & 0x3f) & 1) != 0;
  }
  return bVar4;
}

Assistant:

bool is_col_taken(std::vector<bool> &col_is_taken, hashed_set<size_t> &col_is_taken_s,
                  size_t col_num)
{
    if (!col_is_taken.empty())
        return col_is_taken[col_num];
    else
        return col_is_taken_s.find(col_num) != col_is_taken_s.end();
}